

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eodata.cpp
# Opt level: O0

int read_single_file<ENF>(ENF *pub,Pub_File *file,bool auto_split,int version,int first_id)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  char *__filename;
  FILE *__stream;
  undefined8 uVar4;
  size_t sVar5;
  reference pvVar6;
  long lVar7;
  void *__ptr;
  size_type sVar8;
  int local_108;
  value_type_conflict3 vStack_e8;
  int size;
  size_t last_split;
  data_t *newdata;
  int local_cc;
  long lStack_c8;
  int size_1;
  size_t split;
  int i;
  int local_b0;
  int local_ac;
  int max_entries;
  int readobj;
  char buf [39];
  string local_78 [8];
  string shout;
  string name;
  uchar shoutsize;
  uchar namesize;
  FILE *fh;
  int first_id_local;
  int version_local;
  bool auto_split_local;
  Pub_File *file_local;
  ENF *pub_local;
  
  __filename = (char *)std::__cxx11::string::c_str();
  __stream = fopen(__filename,"rb");
  eodata_safe_fail_filename = (char *)std::__cxx11::string::c_str();
  if (__stream == (FILE *)0x0) {
    uVar4 = std::__cxx11::string::c_str();
    Console::Err("Could not load file: %s",uVar4);
    exit(1);
  }
  first_id_local._3_1_ = auto_split;
  if (first_id != 1) {
    first_id_local._3_1_ = 0;
  }
  std::__cxx11::string::string((string *)(shout.field_2._M_local_buf + 8));
  std::__cxx11::string::string(local_78);
  memset(&max_entries,0,0x27);
  local_ac = 0;
  local_b0 = 900;
  if ((version < 1) && ((first_id_local._3_1_ & 1) == 1)) {
    local_b0 = 64000;
  }
  iVar2 = fseek(__stream,10,0);
  if (iVar2 != 0) {
    fclose(__stream);
    eodata_safe_fail(0xba);
  }
  sVar5 = fread((void *)((long)&name.field_2 + 0xf),1,1,__stream);
  if (sVar5 != 1) {
    fclose(__stream);
    eodata_safe_fail(0xbb);
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve(&file->splits,4);
  for (split._0_4_ = 0; (int)split < local_b0; split._0_4_ = (int)split + 1) {
    if (((first_id_local._3_1_ & 1) != 0) && ((int)split % 900 == 0)) {
      lStack_c8 = ftell(__stream);
      lStack_c8 = lStack_c8 + -1;
      iVar2 = (int)lStack_c8;
      bVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::empty(&file->splits);
      if (bVar1) {
        local_108 = 0;
      }
      else {
        pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::back(&file->splits);
        local_108 = (int)*pvVar6;
      }
      local_cc = iVar2 - local_108;
      if (0xf9f8 < local_cc) {
        uVar3 = local_cc - 0xf9f8;
        uVar4 = std::__cxx11::string::c_str();
        Console::Err("Auto-split file is too large (%d bytes too long): %s",(ulong)uVar3,uVar4);
      }
      lVar7 = ftell(__stream);
      newdata = (data_t *)(lVar7 + -1);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                (&file->splits,(value_type_conflict3 *)&newdata);
    }
    uVar3 = PacketProcessor::Number(name.field_2._M_local_buf[0xf],0xfe,0xfe,0xfe);
    name.field_2._M_local_buf[0xf] = (char)uVar3;
    std::__cxx11::string::resize((ulong)((long)&shout.field_2 + 8));
    if (name.field_2._M_local_buf[0xf] != '\0') {
      __ptr = (void *)std::__cxx11::string::operator[]((ulong)((long)&shout.field_2 + 8));
      sVar5 = fread(__ptr,1,(ulong)(byte)name.field_2._M_local_buf[0xf],__stream);
      if (sVar5 != (byte)name.field_2._M_local_buf[0xf]) {
        fclose(__stream);
        eodata_safe_fail(0xd5);
      }
    }
    sVar5 = fread(&max_entries,1,0x27,__stream);
    if (sVar5 != 0x27) {
      fclose(__stream);
      eodata_safe_fail(0xe0);
    }
    last_split = (size_t)std::vector<ENF_Data_Base<ENF>,_std::allocator<ENF_Data_Base<ENF>_>_>::
                         operator[](&pub->data,(long)(first_id + (int)split));
    local_ac = local_ac + 1;
    ((reference)last_split)->id = first_id + (int)split;
    std::__cxx11::string::operator=
              ((string *)&((reference)last_split)->name,(string *)(shout.field_2._M_local_buf + 8));
    pub_read_record((ENF_Data *)last_split,(char *)&max_entries);
    iVar2 = first_id + (int)split;
    sVar8 = std::vector<ENF_Data_Base<ENF>,_std::allocator<ENF_Data_Base<ENF>_>_>::size(&pub->data);
    if ((sVar8 <= (ulong)(long)iVar2) ||
       (sVar5 = fread((void *)((long)&name.field_2 + 0xf),1,1,__stream), sVar5 != 1)) break;
  }
  vStack_e8 = ftell(__stream);
  iVar2 = (int)vStack_e8;
  pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::back(&file->splits);
  iVar2 = iVar2 - (int)*pvVar6;
  if (0xf9f8 < iVar2) {
    if (((first_id_local._3_1_ & 1) == 0) ||
       (sVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&file->splits),
       sVar8 < 2)) {
      uVar4 = std::__cxx11::string::c_str();
      Console::Err("File is too large (%d bytes too long): %s",(ulong)(iVar2 - 0xf9f8),uVar4);
    }
    else {
      uVar4 = std::__cxx11::string::c_str();
      Console::Err("Auto-split file is too large (%d bytes too long): %s",(ulong)(iVar2 - 0xf9f8),
                   uVar4);
    }
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            (&file->splits,&stack0xffffffffffffff18);
  fclose(__stream);
  iVar2 = local_ac;
  std::__cxx11::string::~string(local_78);
  std::__cxx11::string::~string((string *)(shout.field_2._M_local_buf + 8));
  return iVar2;
}

Assistant:

int read_single_file(T& pub, Pub_File& file, bool auto_split, int version, int first_id)
{
	std::FILE *fh = std::fopen(file.filename.c_str(), "rb");
	eodata_safe_fail_filename = file.filename.c_str();

	if (!fh)
	{
		Console::Err("Could not load file: %s", file.filename.c_str());
		std::exit(1);
	}

	// Only attempt to auto-split the first file
	if (first_id != 1)
		auto_split = false;

	unsigned char namesize, shoutsize;
	std::string name, shout;
	char buf[T::DATA_SIZE] = {0};

	int readobj = 0;
	int max_entries = T::FILE_MAX_ENTRIES;

	if constexpr (std::is_same_v<T, ECF>)
	{
		if (version >= 1)
			max_entries = T::FILE_MAX_ENTRIES_V2;
	}

	if (version < 1 && auto_split == true)
		max_entries = 64000;

	SAFE_SEEK(fh, 10, SEEK_SET);
	SAFE_READ(static_cast<void *>(&namesize), sizeof(char), 1, fh);

	if constexpr (std::is_same_v<T, ESF>)
	{
		SAFE_READ(static_cast<void *>(&shoutsize), sizeof(char), 1, fh);
	}

	file.splits.reserve(4);

	for (int i = 0; i < max_entries; ++i)
	{
		if (auto_split && (i % T::FILE_MAX_ENTRIES == 0))
		{
			std::size_t split = std::size_t(std::ftell(fh)) - 1;
			int size = (int)split - (file.splits.empty() ? 0 : (int)file.splits.back());

			if (size > 63992)
				Console::Err("Auto-split file is too large (%d bytes too long): %s", size - 63992, file.filename.c_str());

			file.splits.push_back(std::size_t(std::ftell(fh)) - 1);
		}

		namesize = PacketProcessor::Number(namesize);
		name.resize(namesize);

		if (namesize > 0)
			SAFE_READ(&name[0], sizeof(char), namesize, fh);

		if constexpr (std::is_same_v<T, ESF>)
		{
			shoutsize = PacketProcessor::Number(shoutsize);
			shout.resize(shoutsize);

			if (shoutsize > 0)
				SAFE_READ(&shout[0], sizeof(char), shoutsize, fh);
		}

		SAFE_READ(buf, sizeof(char), T::DATA_SIZE, fh);

		typename T::data_t& newdata = pub.data[first_id + i];

		++readobj;

		newdata.id = first_id + i;
		newdata.name = name;

		if constexpr (std::is_same_v<T, ESF>)
		{
			newdata.shout = shout;
		}

		pub_read_record(newdata, buf);

		if (first_id + i >= pub.data.size()
		 || std::fread(static_cast<void *>(&namesize), sizeof(char), 1, fh) != 1)
		{
			break;
		}

		if constexpr (std::is_same_v<T, ESF>)
		{
			if (std::fread(static_cast<void *>(&shoutsize), sizeof(char), 1, fh) != 1)
			{
				break;
			}
		}
	}

	std::size_t last_split = std::size_t(std::ftell(fh));
	int size = (int)last_split - (int)file.splits.back();

	if (size > 63992)
	{
		if (auto_split && file.splits.size() > 1)
			Console::Err("Auto-split file is too large (%d bytes too long): %s", size - 63992, file.filename.c_str());
		else
			Console::Err("File is too large (%d bytes too long): %s", size - 63992, file.filename.c_str());
	}

	file.splits.push_back(last_split);

	std::fclose(fh);

	return readobj;
}